

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

void __thiscall
QShortcutEvent::QShortcutEvent
          (QShortcutEvent *this,QKeySequence *key,QShortcut *shortcut,bool ambiguous)

{
  long lVar1;
  QDebug this_00;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebug local_60;
  QKeySequence local_58;
  undefined1 local_50 [8];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QEvent::QEvent(&this->super_QEvent,Shortcut);
  *(undefined ***)this = &PTR__QShortcutEvent_007e46f8;
  QKeySequence::QKeySequence(&this->m_sequence,key);
  this->m_shortcutId = 0;
  this->m_ambiguous = ambiguous;
  if (shortcut != (QShortcut *)0x0) {
    lVar1 = *(long *)&shortcut->field_0x8;
    qVar2 = QtPrivate::indexOf<QKeySequence,QKeySequence>
                      ((QList<QKeySequence> *)(lVar1 + 0x78),key,0);
    if (qVar2 < 0) {
      QMessageLogger::warning();
      this_00.stream = local_60.stream;
      QVar3.m_data = (storage_type *)0x2e;
      QVar3.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar3);
      QTextStream::operator<<(&(this_00.stream)->ts,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      local_58.d = (QKeySequencePrivate *)local_60.stream;
      (local_60.stream)->ref = (local_60.stream)->ref + 1;
      ::operator<<((Stream *)local_50,&local_58);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug((QDebug *)&local_58);
      QDebug::~QDebug(&local_60);
    }
    else {
      this->m_shortcutId = *(int *)(*(long *)(lVar1 + 0xb8) + qVar2 * 4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QShortcutEvent::QShortcutEvent(const QKeySequence &key, const QShortcut *shortcut, bool ambiguous)
    : QEvent(Shortcut), m_sequence(key), m_shortcutId(0), m_ambiguous(ambiguous)
{
    if (shortcut) {
        auto priv = static_cast<const QShortcutPrivate *>(QShortcutPrivate::get(shortcut));
        auto index = priv->sc_sequences.indexOf(key);
        if (index < 0) {
            qWarning() << "Given QShortcut does not contain key-sequence " << key;
            return;
        }
        m_shortcutId = priv->sc_ids[index];
    }
}